

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O0

DynamicVector<double,_std::allocator<double>_> * __thiscall
OpenMD::DynamicRectMatrix<double>::getColumn(DynamicRectMatrix<double> *this,uint col)

{
  reference pvVar1;
  uint in_EDX;
  long *in_RSI;
  DynamicVector<double,_std::allocator<double>_> *in_RDI;
  uint j;
  DynamicVector<double,_std::allocator<double>_> *v;
  size_type in_stack_ffffffffffffff98;
  DynamicVector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  DynamicVector<double,_std::allocator<double>_> *this_00;
  uint local_28;
  
  std::allocator<double>::allocator((allocator<double> *)0x1340f5);
  DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(allocator_type *)0x134109);
  std::allocator<double>::~allocator((allocator<double> *)0x134115);
  for (local_28 = 0; local_28 < *(uint *)(in_RSI + 1); local_28 = local_28 + 1) {
    this_00 = *(DynamicVector<double,_std::allocator<double>_> **)
               (*(long *)(*in_RSI + (ulong)local_28 * 8) + (ulong)in_EDX * 8);
    pvVar1 = DynamicVector<double,_std::allocator<double>_>::operator[]
                       (this_00,in_stack_ffffffffffffff98);
    *pvVar1 = (value_type)this_00;
  }
  return in_RDI;
}

Assistant:

DynamicVector<Real> getColumn(unsigned int col) {
      DynamicVector<Real> v(ncol_);

      for (unsigned int j = 0; j < nrow_; j++)
        v[j] = this->data_[j][col];

      return v;
    }